

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::~XdlEncoder(XdlEncoder *this)

{
  XdlEncoder *this_local;
  
  if (this->_sink != (XdlSink *)0x0) {
    (*this->_sink->_vptr_XdlSink[1])();
  }
  asl::String::~String(&this->_sep2);
  asl::String::~String(&this->_sep1);
  asl::String::~String(&this->_indent);
  asl::String::~String(&this->_out);
  return;
}

Assistant:

XdlEncoder::~XdlEncoder()
{
	delete _sink;
}